

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h2.c
# Opt level: O1

int rops_perform_user_POLLOUT_h2(lws *wsi)

{
  undefined1 *puVar1;
  byte bVar2;
  _lws_websocket_related *p_Var3;
  bool bVar4;
  lws **pplVar5;
  int iVar6;
  uint uVar7;
  lws *wsi_00;
  lws *wsi_01;
  size_t len;
  lws_http_mount *plVar8;
  lws_protocols *p;
  char *pcVar9;
  lws **pplVar10;
  lws **pplVar11;
  uchar *buf_00;
  lws_write_protocol wp;
  uint8_t buf [17];
  lws_write_protocol local_50;
  lws_write_protocol local_4c [5];
  uchar local_38 [8];
  
  wsi_00 = lws_get_network_wsi(wsi);
  (wsi_00->mux).requested_POLLOUT = '\0';
  lws_wsi_mux_dump_waiting_children(wsi_00);
  if ((wsi_00->mux).child_list == (lws *)0x0) {
    iVar6 = 0;
  }
  else {
    pplVar11 = &(wsi_00->mux).child_list;
    local_50 = LWS_WRITE_PONG;
    pplVar10 = pplVar11;
    do {
      pplVar5 = &((*pplVar10)->mux).sibling_list;
      bVar4 = true;
      if (((*pplVar10)->mux).requested_POLLOUT == '\0') goto LAB_00131cb4;
      _lws_log(0x10,"servicing child %p\n");
      wsi_01 = lws_wsi_mux_move_child_to_tail(pplVar10);
      if (wsi_01 == (lws *)0x0) {
LAB_00131cb1:
        bVar4 = true;
        pplVar5 = pplVar11;
        goto LAB_00131cb4;
      }
      _lws_log(8,"%s: child %p (wsistate 0x%x)\n","rops_perform_user_POLLOUT_h2",wsi_01,
               (ulong)wsi_01->wsistate);
      if (wsi_01->buflist_out == (lws_buflist *)0x0) {
        if ((short)wsi_01->wsistate == 0x11e) {
          *(ulong *)&wsi_01->field_0x2dc = *(ulong *)&wsi_01->field_0x2dc | 0x1000;
          goto LAB_00131793;
        }
        *(ulong *)&wsi_01->field_0x2dc = *(ulong *)&wsi_01->field_0x2dc & 0xfffffbffffffffff;
        wsi_00->field_0x2e1 = wsi_00->field_0x2e1 & 0xfb;
        pcVar9 = (wsi_01->h2).pending_status_body;
        if (pcVar9 != (char *)0x0) {
          puVar1 = &(wsi_01->h2).field_0x11;
          *puVar1 = *puVar1 | 4;
          buf_00 = (uchar *)(pcVar9 + 0x10);
          len = strlen((char *)buf_00);
          lws_write(wsi_01,buf_00,len,LWS_WRITE_HTTP_FINAL);
          lws_realloc((wsi_01->h2).pending_status_body,0,"free");
          (wsi_01->h2).pending_status_body = (char *)0x0;
          lws_close_free_wsi(wsi_01,LWS_CLOSE_STATUS_NOSTATUS,"h2 end stream 1");
          goto LAB_001317ad;
        }
        if ((short)wsi_01->wsistate == 0x15) {
          iVar6 = lws_h2_tx_cr_get(wsi_01);
          iVar6 = lws_wsi_txc_check_skint(&wsi_01->txc,iVar6);
          if (iVar6 != 0) goto LAB_00131cb1;
          wsi_01->leave_pollout_active = '\0';
          uVar7 = lws_serve_http_file_fragment(wsi_01);
          _lws_log(0x10,"lws_serve_http_file_fragment says %d\n",(ulong)uVar7);
          if (((int)uVar7 < 0) || (((wsi_01->h2).field_0x11 & 4) != 0)) {
            _lws_log(0x10,"Closing POLLOUT child %p\n",wsi_01);
            pcVar9 = "h2 end stream file";
            goto LAB_00131cac;
          }
          if (uVar7 == 0) {
LAB_00131bae:
            bVar4 = true;
            lws_callback_on_writable(wsi_01);
            (wsi_01->mux).requested_POLLOUT = '\x01';
            goto LAB_00131cb4;
          }
          iVar6 = lws_http_transaction_completed(wsi_01);
joined_r0x00131b1f:
          bVar4 = iVar6 == 0;
          if (!bVar4) {
LAB_00131881:
            pplVar5 = pplVar10;
          }
        }
        else {
          uVar7 = wsi_01->wsistate & 0xffff;
          if (uVar7 == 0x110) {
            lwsi_set_state(wsi_01,0x119);
            pcVar9 = lws_hdr_simple_ptr(wsi_01,WSI_TOKEN_HTTP_COLON_METHOD);
            bVar4 = true;
            if ((pcVar9 != (char *)0x0) && (iVar6 = strcmp(pcVar9,"POST"), iVar6 == 0)) {
              pcVar9 = lws_hdr_simple_ptr(wsi_01,WSI_TOKEN_HTTP_COLON_PATH);
              iVar6 = lws_hdr_total_length(wsi_01,WSI_TOKEN_HTTP_COLON_PATH);
              plVar8 = lws_find_mount(wsi_01,pcVar9,iVar6);
              pcVar9 = lws_hdr_simple_ptr(wsi_01,WSI_TOKEN_HTTP_COLON_PATH);
              if (plVar8 == (lws_http_mount *)0x0) {
                _lws_log(0x10,"%s: %s: hit %p: %s\n","lws_h2_bind_for_post_before_action",pcVar9,0,
                         "null");
LAB_00131c2c:
                _lws_log(8,"%s: setting LRS_BODY from 0x%x (%s)\n",
                         "lws_h2_bind_for_post_before_action",(ulong)wsi_01->wsistate,
                         wsi_01->protocol->name);
                lwsi_set_state(wsi_01,0x17);
              }
              else {
                _lws_log(0x10,"%s: %s: hit %p: %s\n","lws_h2_bind_for_post_before_action",pcVar9,
                         plVar8,plVar8->origin);
                pcVar9 = plVar8->protocol;
                if (pcVar9 == (char *)0x0) {
                  pcVar9 = plVar8->origin;
                }
                p = lws_vhost_name_to_protocol(wsi_01->vhost,pcVar9);
                if (p == (lws_protocols *)0x0) {
                  _lws_log(8,"Unable to find protocol \'%s\'\n",pcVar9);
                }
                else {
                  iVar6 = lws_bind_protocol(wsi_01,p,"lws_h2_bind_for_post_before_action");
                  if (iVar6 == 0) goto LAB_00131c2c;
                }
              }
            }
            _lws_log(8,"  h2 action start...\n");
            uVar7 = lws_http_action(wsi_01);
            pplVar10 = pplVar5;
            if ((int)uVar7 < 0) {
              _lws_log(8,"   h2 action result %d\n",(ulong)uVar7);
            }
            else {
              _lws_log(8,"  h2 action result %d (wsi->http.rx_content_remain %lld)\n",(ulong)uVar7,
                       (wsi_01->http).rx_content_remain);
              if (((wsi_01->h2).pending_status_body == (char *)0x0) &&
                 ((uVar7 != 0 || (((wsi_01->h2).field_0x11 & 4) != 0)))) {
                _lws_log(8,"closing stream after h2 action\n");
                lws_close_free_wsi(wsi_01,LWS_CLOSE_STATUS_NOSTATUS,"h2 end stream");
                pplVar10 = pplVar11;
              }
            }
            pplVar5 = pplVar11;
            if (-1 < (int)uVar7) {
              pplVar5 = pplVar10;
            }
          }
          else {
            bVar4 = true;
            if (uVar7 == 0x10f) {
              iVar6 = lws_h2_client_handshake(wsi_01);
              goto joined_r0x00131b1f;
            }
            if (uVar7 == 0x11b && wsi_01->role_ops == &role_ops_ws) {
              _lws_log(0x10,"sending close packet\n");
              wsi_01->field_0x2df = wsi_01->field_0x2df & 0xfd;
              iVar6 = lws_write(wsi_01,wsi_01->ws->ping_payload_buf + 0x10,
                                (ulong)wsi_01->ws->close_in_ping_buffer_len,4);
              if (-1 < iVar6) {
                lwsi_set_state(wsi_01,0x11d);
                lws_set_timeout(wsi_01,PENDING_TIMEOUT_CLOSE_ACK,5);
                _lws_log(0x10,"sent close frame, awaiting ack\n");
              }
            }
            else {
              if (((wsi_01->role_ops == &role_ops_ws) && ((wsi_01->ws->field_0x95 & 0x80) != 0)) ||
                 ((uVar7 == 0x11c && ((wsi_01->ws->field_0x95 & 0x40) != 0)))) {
                p_Var3 = wsi_01->ws;
                if ((*(ushort *)&p_Var3->field_0x95 & 0x40) != 0) {
                  local_50 = 0x84;
                }
                iVar6 = lws_write(wsi_01,p_Var3->ping_payload_buf + 0x10,
                                  (ulong)p_Var3->ping_payload_len,local_50);
                if (-1 < iVar6) {
                  puVar1 = &wsi_01->ws->field_0x95;
                  *(ushort *)puVar1 = *(ushort *)puVar1 & 0xff7f;
                  if ((wsi_01->ws->field_0x95 & 0x40) == 0) goto LAB_00131bae;
                  _lws_log(0x10,"Ack\'d peer\'s close packet\n");
                  puVar1 = &wsi_01->ws->field_0x95;
                  *(ushort *)puVar1 = *(ushort *)puVar1 & 0xffbf;
                  lwsi_set_state(wsi_01,0x11c);
                  pcVar9 = "returned close packet";
LAB_00131cac:
                  lws_close_free_wsi(wsi_01,LWS_CLOSE_STATUS_NOSTATUS,pcVar9);
                  goto LAB_00131cb1;
                }
                bVar4 = false;
                goto LAB_00131881;
              }
              if ((~(wsi_01->h2).field_0x11 & 0xc) == 0) {
                local_4c[0] = LWS_WRITE_TEXT;
                iVar6 = rops_write_role_protocol_h2(wsi_01,local_38,0,local_4c);
                if (iVar6 == 0) {
                  _lws_log(8,"%s: wsi %p: entering ro long poll\n","rops_perform_user_POLLOUT_h2",
                           wsi_01);
                  lws_mux_mark_immortal(wsi_01);
                }
                else {
                  _lws_log(1,"%s: wsi %p: failed to set long poll\n","rops_perform_user_POLLOUT_h2",
                           wsi_01);
                }
              }
              else {
                iVar6 = lws_callback_as_writeable(wsi_01);
                bVar2 = (wsi_01->h2).field_0x11;
                if (iVar6 != 0) {
                  _lws_log(8,"Closing POLLOUT child (end stream %d)\n",(ulong)(bVar2 >> 2 & 1));
                  pcVar9 = "h2 pollout handle";
                  goto LAB_00131cac;
                }
                if ((bVar2 & 4) != 0) {
                  lws_h2_state(wsi_01,LWS_H2_STATE_HALF_CLOSED_LOCAL);
                }
              }
            }
          }
        }
      }
      else {
        _lws_log(0x10,"%s: completing partial\n","rops_perform_user_POLLOUT_h2");
        iVar6 = lws_issue_raw(wsi_01,(uchar *)0x0,0);
        if (iVar6 < 0) {
          _lws_log(8,"%s signalling to close\n","rops_perform_user_POLLOUT_h2");
LAB_00131793:
          lws_close_free_wsi(wsi_01,LWS_CLOSE_STATUS_NOSTATUS,"h2 end stream 1");
        }
        else {
          lws_callback_on_writable(wsi_01);
        }
LAB_001317ad:
        bVar4 = true;
        pplVar5 = pplVar11;
      }
LAB_00131cb4:
      pplVar10 = pplVar5;
      if (!bVar4) {
        return -1;
      }
    } while ((*pplVar10 != (lws *)0x0) && (iVar6 = lws_send_pipe_choked(wsi_00), iVar6 == 0));
    iVar6 = lws_wsi_mux_action_pending_writeable_reqs(wsi_00);
    iVar6 = -(uint)(iVar6 != 0);
  }
  return iVar6;
}

Assistant:

static int
rops_perform_user_POLLOUT_h2(struct lws *wsi)
{
	struct lws **wsi2;
#if defined(LWS_ROLE_WS)
	int write_type = LWS_WRITE_PONG;
#endif
	int n;

	wsi = lws_get_network_wsi(wsi);

	wsi->mux.requested_POLLOUT = 0;
//	if (!wsi->h2.initialized) {
//		lwsl_info("pollout on uninitialized http2 conn\n");
//		return 0;
//	}

	lws_wsi_mux_dump_waiting_children(wsi);

	wsi2 = &wsi->mux.child_list;
	if (!*wsi2)
		return 0;

	do {
		struct lws *w, **wa;

		wa = &(*wsi2)->mux.sibling_list;
		if (!(*wsi2)->mux.requested_POLLOUT)
			goto next_child;

		/*
		 * we're going to do writable callback for this child.
		 * move him to be the last child
		 */

		lwsl_debug("servicing child %p\n", *wsi2);

		w = lws_wsi_mux_move_child_to_tail(wsi2);

		if (!w) {
			wa = &wsi->mux.child_list;
			goto next_child;
		}

		lwsl_info("%s: child %p (wsistate 0x%x)\n", __func__, w,
			  (unsigned int)w->wsistate);

		/* priority 1: post compression-transform buffered output */

		if (lws_has_buffered_out(w)) {
			lwsl_debug("%s: completing partial\n", __func__);
			if (lws_issue_raw(w, NULL, 0) < 0) {
				lwsl_info("%s signalling to close\n", __func__);
				lws_close_free_wsi(w, LWS_CLOSE_STATUS_NOSTATUS,
						   "h2 end stream 1");
				wa = &wsi->mux.child_list;
				goto next_child;
			}
			lws_callback_on_writable(w);
			wa = &wsi->mux.child_list;
			goto next_child;
		}

		/* priority 2: pre compression-transform buffered output */

#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
		if (w->http.comp_ctx.buflist_comp ||
		    w->http.comp_ctx.may_have_more) {
			enum lws_write_protocol wp = LWS_WRITE_HTTP;

			lwsl_info("%s: completing comp partial"
				   "(buflist_comp %p, may %d)\n",
				   __func__, w->http.comp_ctx.buflist_comp,
				    w->http.comp_ctx.may_have_more);

			if (rops_write_role_protocol_h2(w, NULL, 0, &wp) < 0) {
				lwsl_info("%s signalling to close\n", __func__);
				lws_close_free_wsi(w, LWS_CLOSE_STATUS_NOSTATUS,
						   "comp write fail");
			}
			lws_callback_on_writable(w);
			wa = &wsi->mux.child_list;
			goto next_child;
		}
#endif

		/* priority 3: if no buffered out and waiting for that... */

		if (lwsi_state(w) == LRS_FLUSHING_BEFORE_CLOSE) {
			w->socket_is_permanently_unusable = 1;
			lws_close_free_wsi(w, LWS_CLOSE_STATUS_NOSTATUS,
					   "h2 end stream 1");
			wa = &wsi->mux.child_list;
			goto next_child;
		}

		/* if we arrived here, even by looping, we checked choked */
		w->could_have_pending = 0;
		wsi->could_have_pending = 0;

		if (w->h2.pending_status_body) {
			w->h2.send_END_STREAM = 1;
			n = lws_write(w, (uint8_t *)w->h2.pending_status_body +
					 LWS_PRE,
				         strlen(w->h2.pending_status_body +
					        LWS_PRE), LWS_WRITE_HTTP_FINAL);
			lws_free_set_NULL(w->h2.pending_status_body);
			lws_close_free_wsi(w, LWS_CLOSE_STATUS_NOSTATUS,
					   "h2 end stream 1");
			wa = &wsi->mux.child_list;
			goto next_child;
		}

#if defined(LWS_WITH_CLIENT)
		if (lwsi_state(w) == LRS_H2_WAITING_TO_SEND_HEADERS) {
			if (lws_h2_client_handshake(w))
				return -1;

			goto next_child;
		}
#endif

#if defined(LWS_WITH_SERVER)
		if (lwsi_state(w) == LRS_DEFERRING_ACTION) {

			/*
			 * we had to defer the http_action to the POLLOUT
			 * handler, because we know it will send something and
			 * only in the POLLOUT handler do we know for sure
			 * that there is no partial pending on the network wsi.
			 */

			lwsi_set_state(w, LRS_ESTABLISHED);

			lws_h2_bind_for_post_before_action(w);

			lwsl_info("  h2 action start...\n");
			n = lws_http_action(w);
			if (n < 0)
				lwsl_info ("   h2 action result %d\n", n);
			else
			lwsl_info("  h2 action result %d "
				  "(wsi->http.rx_content_remain %lld)\n",
				  n, w->http.rx_content_remain);

			/*
			 * Commonly we only managed to start a larger transfer
			 * that will complete asynchronously under its own wsi
			 * states.  In those cases we will hear about
			 * END_STREAM going out in the POLLOUT handler.
			 */
			if (n >= 0 && !w->h2.pending_status_body &&
			    (n || w->h2.send_END_STREAM)) {
				lwsl_info("closing stream after h2 action\n");
				lws_close_free_wsi(w, LWS_CLOSE_STATUS_NOSTATUS,
						   "h2 end stream");
				wa = &wsi->mux.child_list;
			}

			if (n < 0)
				wa = &wsi->mux.child_list;

			goto next_child;
		}

#if defined(LWS_WITH_FILE_OPS)

		if (lwsi_state(w) == LRS_ISSUING_FILE) {

			if (lws_wsi_txc_check_skint(&w->txc,
						    lws_h2_tx_cr_get(w))) {
				wa = &wsi->mux.child_list;
				goto next_child;
			}

			((volatile struct lws *)w)->leave_pollout_active = 0;

			/* >0 == completion, <0 == error
			 *
			 * We'll get a LWS_CALLBACK_HTTP_FILE_COMPLETION
			 * callback when it's done.  That's the case even if we
			 * just completed the send, so wait for that.
			 */
			n = lws_serve_http_file_fragment(w);
			lwsl_debug("lws_serve_http_file_fragment says %d\n", n);

			/*
			 * We will often hear about out having sent the final
			 * DATA here... if so close the actual wsi
			 */
			if (n < 0 || w->h2.send_END_STREAM) {
				lwsl_debug("Closing POLLOUT child %p\n", w);
				lws_close_free_wsi(w, LWS_CLOSE_STATUS_NOSTATUS,
						   "h2 end stream file");
				wa = &wsi->mux.child_list;
				goto next_child;
			}
			if (n > 0)
				if (lws_http_transaction_completed(w))
					return -1;
			if (!n) {
				lws_callback_on_writable(w);
				(w)->mux.requested_POLLOUT = 1;
			}

			goto next_child;
		}
#endif
#endif

#if defined(LWS_ROLE_WS)

		/* Notify peer that we decided to close */

		if (lwsi_role_ws(w) &&
		    lwsi_state(w) == LRS_WAITING_TO_SEND_CLOSE) {
			lwsl_debug("sending close packet\n");
			w->waiting_to_send_close_frame = 0;
			n = lws_write(w, &w->ws->ping_payload_buf[LWS_PRE],
				      w->ws->close_in_ping_buffer_len,
				      LWS_WRITE_CLOSE);
			if (n >= 0) {
				lwsi_set_state(w, LRS_AWAITING_CLOSE_ACK);
				lws_set_timeout(w, PENDING_TIMEOUT_CLOSE_ACK, 5);
				lwsl_debug("sent close frame, awaiting ack\n");
			}

			goto next_child;
		}

		/*
		 * Acknowledge receipt of peer's notification he closed,
		 * then logically close ourself
		 */

		if ((lwsi_role_ws(w) && w->ws->ping_pending_flag) ||
		    (lwsi_state(w) == LRS_RETURNED_CLOSE &&
		     w->ws->payload_is_close)) {

			if (w->ws->payload_is_close)
				write_type = LWS_WRITE_CLOSE |
					     LWS_WRITE_H2_STREAM_END;

			n = lws_write(w, &w->ws->ping_payload_buf[LWS_PRE],
				      w->ws->ping_payload_len, write_type);
			if (n < 0)
				return -1;

			/* well he is sent, mark him done */
			w->ws->ping_pending_flag = 0;
			if (w->ws->payload_is_close) {
				/* oh... a close frame... then we are done */
				lwsl_debug("Ack'd peer's close packet\n");
				w->ws->payload_is_close = 0;
				lwsi_set_state(w, LRS_RETURNED_CLOSE);
				lws_close_free_wsi(w, LWS_CLOSE_STATUS_NOSTATUS,
						   "returned close packet");
				wa = &wsi->mux.child_list;
				goto next_child;
			}

			lws_callback_on_writable(w);
			(w)->mux.requested_POLLOUT = 1;

			/* otherwise for PING, leave POLLOUT active both ways */
			goto next_child;
		}
#endif

		/*
		 * set client wsi to immortal long-poll mode; send END_STREAM
		 * flag on headers to indicate to a server, that allows
		 * it, that you want them to leave the stream in a long poll
		 * ro immortal state.  We have to send headers so the client
		 * understands the http connection is ongoing.
		 */

		if (w->h2.send_END_STREAM && w->h2.long_poll) {
			uint8_t buf[LWS_PRE + 1];
			enum lws_write_protocol wp = 0;

			if (!rops_write_role_protocol_h2(w, buf + LWS_PRE, 0,
							 &wp)) {
				lwsl_info("%s: wsi %p: entering ro long poll\n",
					  __func__, w);
				lws_mux_mark_immortal(w);
			} else
				lwsl_err("%s: wsi %p: failed to set long poll\n",
						__func__, w);
			goto next_child;
		}

		if (lws_callback_as_writeable(w)) {
			lwsl_info("Closing POLLOUT child (end stream %d)\n",
				  w->h2.send_END_STREAM);
			lws_close_free_wsi(w, LWS_CLOSE_STATUS_NOSTATUS,
					   "h2 pollout handle");
			wa = &wsi->mux.child_list;
		} else
			 if (w->h2.send_END_STREAM)
				lws_h2_state(w, LWS_H2_STATE_HALF_CLOSED_LOCAL);

next_child:
		wsi2 = wa;
	} while (wsi2 && *wsi2 && !lws_send_pipe_choked(wsi));

	// lws_wsi_mux_dump_waiting_children(wsi);

	if (lws_wsi_mux_action_pending_writeable_reqs(wsi))
		return -1;

	return 0;
}